

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  ushort uVar1;
  int iVar2;
  SegmentReader *pSVar3;
  CapTableReader *pCVar4;
  WirePointer *pWVar5;
  Reader right_00;
  bool bVar6;
  Equality EVar7;
  ulong uVar8;
  ulong uVar9;
  Equality EVar10;
  ulong uVar11;
  Reader l;
  undefined4 uStack_44;
  ArrayPtr<const_unsigned_char> local_40;
  
  l.reader.segment = (SegmentReader *)(this->_reader).data;
  pCVar4 = (CapTableReader *)(ulong)((this->_reader).dataSize >> 3);
  do {
    l.reader.capTable = pCVar4;
    if (l.reader.capTable == (CapTableReader *)0x0) break;
    pCVar4 = (CapTableReader *)((long)&l.reader.capTable[-1]._vptr_CapTableReader + 7);
  } while (((undefined1 *)((long)&l.reader.segment[-1].readLimiter + 7))[(long)l.reader.capTable] ==
           '\0');
  uVar11 = (ulong)(right._reader.dataSize >> 3);
  do {
    local_40.size_ = uVar11;
    if (local_40.size_ == 0) break;
    uVar11 = local_40.size_ - 1;
  } while (*(char *)((long)right._reader.data + (local_40.size_ - 1)) == '\0');
  local_40.ptr = (uchar *)right._reader.data;
  bVar6 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&l,&local_40);
  EVar10 = NOT_EQUAL;
  if (bVar6) {
    pSVar3 = (this->_reader).segment;
    pCVar4 = (this->_reader).capTable;
    pWVar5 = (this->_reader).pointers;
    uVar1 = (this->_reader).pointerCount;
    iVar2 = (this->_reader).nestingLimit;
    uVar8 = (ulong)uVar1 * 0x40 + 0x3fffffffc0;
    uVar11 = (ulong)uVar1;
    while (uVar11 != 0) {
      l.reader.pointer =
           (WirePointer *)((long)&(pWVar5->offsetAndKind).value + (uVar8 >> 3 & 0x7fffffff8));
      l.reader.segment = pSVar3;
      l.reader.capTable = pCVar4;
      l.reader.nestingLimit = iVar2;
      bVar6 = AnyPointer::Reader::isNull(&l);
      if (!bVar6) break;
      uVar8 = uVar8 - 0x40;
      uVar11 = uVar11 - 1;
    }
    uVar9 = (ulong)right._reader.pointerCount * 0x40 + 0x3fffffffc0;
    uVar8 = (ulong)right._reader.pointerCount;
    while (uVar8 != 0) {
      l.reader.pointer =
           (WirePointer *)
           ((long)&((right._reader.pointers)->offsetAndKind).value + (uVar9 >> 3 & 0x7fffffff8));
      l.reader.segment = right._reader.segment;
      l.reader.capTable = right._reader.capTable;
      l.reader.nestingLimit = right._reader.nestingLimit;
      bVar6 = AnyPointer::Reader::isNull(&l);
      if (!bVar6) break;
      uVar9 = uVar9 - 0x40;
      uVar8 = uVar8 - 1;
    }
    EVar10 = NOT_EQUAL;
    if (uVar11 == uVar8) {
      EVar10 = EQUAL;
      uVar8 = 0;
      while (bVar6 = uVar11 != 0, uVar11 = uVar11 - 1, bVar6) {
        l.reader.pointer =
             (WirePointer *)((long)&(pWVar5->offsetAndKind).value + (uVar8 & 0x7fffffff8));
        right_00.reader._28_4_ = uStack_44;
        right_00.reader.nestingLimit = right._reader.nestingLimit;
        right_00.reader.pointer =
             (WirePointer *)
             ((long)&((right._reader.pointers)->offsetAndKind).value + (uVar8 & 0x7fffffff8));
        right_00.reader.segment = (SegmentReader *)SUB168(right._reader._0_16_,0);
        right_00.reader.capTable = (CapTableReader *)SUB168(right._reader._0_16_,8);
        l.reader.segment = pSVar3;
        l.reader.capTable = pCVar4;
        l.reader.nestingLimit = iVar2;
        EVar7 = AnyPointer::Reader::equals(&l,right_00);
        if ((EVar7 != EQUAL) && (EVar10 = EVar7, EVar7 != UNKNOWN_CONTAINS_CAPS)) {
          if (EVar7 == NOT_EQUAL) {
            return NOT_EQUAL;
          }
          kj::_::unreachable();
        }
        uVar8 = uVar8 + 8;
      }
    }
  }
  return EVar10;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataL.first(dataSizeL) != dataR.first(dataSizeR)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}